

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::UniversalPrinter<std::optional<unsigned_long>_>::Print
               (Optional<unsigned_long> *value,ostream *os)

{
  bool bVar1;
  unsigned_long *value_00;
  ostream *os_local;
  Optional<unsigned_long> *value_local;
  
  std::operator<<(os,'(');
  bVar1 = std::optional::operator_cast_to_bool((optional *)value);
  if (bVar1) {
    value_00 = std::optional<unsigned_long>::operator*(value);
    UniversalPrint<unsigned_long>(value_00,os);
  }
  else {
    std::operator<<(os,"nullopt");
  }
  std::operator<<(os,')');
  return;
}

Assistant:

static void Print(const Optional<T>& value, ::std::ostream* os) {
    *os << '(';
    if (!value) {
      *os << "nullopt";
    } else {
      UniversalPrint(*value, os);
    }
    *os << ')';
  }